

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbd.c
# Opt level: O0

int universal_argument(int f,int n)

{
  int iVar1;
  PF funct_00;
  long lVar2;
  int local_30;
  int local_2c;
  int nn;
  int c;
  PF funct;
  KEYMAP *curmap;
  uint local_10;
  int n_local;
  int f_local;
  
  local_30 = 4;
  curmap._4_4_ = n;
  local_10 = f;
  if ((f & 1U) != 0) {
    local_30 = n * 4;
  }
  while( true ) {
    local_2c = getkey(1);
    key.k_chars[0] = (KCHAR)local_2c;
    key.k_count = 1;
    if (local_2c == 0x2d) {
      iVar1 = negative_argument(local_10,local_30);
      return iVar1;
    }
    if ((0x2f < local_2c) && (local_2c < 0x3a)) break;
    funct = (PF)curbp->b_modes[curbp->b_nmodes]->p_map;
    while (funct_00 = doscan((KEYMAP *)funct,local_2c,(KEYMAP **)&funct), funct_00 == (PF)0x0) {
      local_2c = getkey(1);
      lVar2 = (long)key.k_count;
      key.k_count = key.k_count + 1;
      key.k_chars[lVar2] = (KCHAR)local_2c;
    }
    if (funct_00 != universal_argument) {
      if ((macrodef != 0) && (macrocount < 0xff)) {
        if ((local_10 & 7) != 0) {
          macrocount = macrocount + -1;
        }
        lVar2 = (long)macrocount;
        macrocount = macrocount + 1;
        macro[lVar2].m_count = local_30;
        lVar2 = (long)macrocount;
        macrocount = macrocount + 1;
        macro[lVar2].m_funct = funct_00;
      }
      iVar1 = mgwrap(funct_00,1,local_30);
      return iVar1;
    }
    local_30 = local_30 << 2;
  }
  iVar1 = digit_argument(local_10,local_30);
  return iVar1;
}

Assistant:

int
universal_argument(int f, int n)
{
	KEYMAP	*curmap;
	PF	 funct;
	int	 c, nn = 4;

	if (f & FFUNIV)
		nn *= n;
	for (;;) {
		key.k_chars[0] = c = getkey(TRUE);
		key.k_count = 1;
		if (c == '-')
			return (negative_argument(f, nn));
		if (c >= '0' && c <= '9')
			return (digit_argument(f, nn));
		curmap = curbp->b_modes[curbp->b_nmodes]->p_map;
		while ((funct = doscan(curmap, c, &curmap)) == NULL) {
			key.k_chars[key.k_count++] = c = getkey(TRUE);
		}
		if (funct != universal_argument) {
			if (macrodef && macrocount < MAXMACRO - 1) {
				if (f & FFARG)
					macrocount--;
				macro[macrocount++].m_count = nn;
				macro[macrocount++].m_funct = funct;
			}
			return (mgwrap(funct, FFUNIV, nn));
		}
		nn <<= 2;
	}
}